

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minijson_reader.hpp
# Opt level: O2

utf8_char minijson::detail::utf16_to_utf8(uint16_t high,uint16_t low)

{
  uint32_t utf32_char;
  utf8_char uVar1;
  
  utf32_char = utf16_to_utf32(high,low);
  uVar1 = utf32_to_utf8(utf32_char);
  return (utf8_char)uVar1.bytes;
}

Assistant:

inline utf8_char utf16_to_utf8(uint16_t high, uint16_t low)
{
    return utf32_to_utf8(utf16_to_utf32(high, low));
}